

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O1

uint RDL_edgeId(RDL_graph *gra,uint from,uint to)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = (ulong)to;
  if (from < to) {
    uVar2 = (ulong)from;
  }
  if (to < from) {
    to = from;
  }
  if (gra->degree[uVar2] != 0) {
    lVar1 = 0;
    do {
      if (gra->adjList[uVar2][lVar1][0] == to) {
        return gra->adjList[uVar2][lVar1][1];
      }
      lVar1 = lVar1 + 1;
    } while (gra->degree[uVar2] != (uint)lVar1);
  }
  return 0xffffffff;
}

Assistant:

unsigned RDL_edgeId(const RDL_graph *gra, unsigned from, unsigned to)
{
  unsigned j, edge;

  if(from > to) {
    /*swap order to make from < to*/
    edge = to;
    to = from;
    from = edge;
  }

  edge = RDL_INVALID_RESULT;

  for(j=0; j<gra->degree[from]; ++j) {
    if(gra->adjList[from][j][0] == to) {
      edge = gra->adjList[from][j][1];
      break;
    }
  }

  return edge;
}